

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  BBox1f BVar4;
  size_t end;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_> *pvVar5
  ;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar6;
  PrimRefMB *pPVar7;
  MemoryMonitorInterface *pMVar8;
  PrimRefVector pmVar9;
  code *pcVar10;
  ThreadLocal2 *pTVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  BBox1f BVar17;
  bool bVar18;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar19;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar20;
  vuint<4> vVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  char cVar24;
  mvector<PrimRefMB> *prims;
  size_t sVar25;
  tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  tVar26;
  intrusive_list_node *piVar27;
  size_t sVar28;
  long lVar29;
  undefined8 *puVar30;
  runtime_error *prVar31;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar32;
  float *pfVar33;
  unsigned_long uVar34;
  range<unsigned_long> *prVar35;
  Split *pSVar36;
  ulong uVar37;
  PrimRefMB *pPVar38;
  char *pcVar39;
  int iVar40;
  task_group_context *ptVar41;
  size_t sVar42;
  long lVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  unsigned_long uVar47;
  size_t i_3;
  Split *pSVar48;
  ulong uVar49;
  int iVar50;
  SetMB *this_00;
  size_t i_5;
  BBox1f *pBVar51;
  bool bVar52;
  bool bVar53;
  uint uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 local_1ee8 [16];
  undefined8 uStack_1ee0;
  undefined1 local_1ed8 [16];
  ulong local_1ec0;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1ea8 [16];
  undefined1 local_1e98 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e48;
  PrimRefVector lprims;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e08 [9];
  anon_class_1_0_00000001 reduction;
  undefined8 local_1d58;
  undefined1 local_1d48 [16];
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  undefined1 local_1d18 [16];
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c88 [16];
  PrimInfoMB right;
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ba8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b98 [2];
  size_t local_1b78;
  size_t local_1b70;
  BBox1f local_1b50;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b48;
  BinSplit<32UL> local_1b38;
  float local_1af8;
  float fStack_1af4;
  undefined8 uStack_1af0;
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ad8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8 [4];
  size_t local_1a78;
  size_t local_1a70;
  float local_1a50;
  float fStack_1a4c;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a48;
  BinSplit<32UL> local_1a38;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1998;
  unsigned_long local_1990;
  vint vSplitPos;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar30 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar30 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar30 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar30 + 2),(string *)&children);
    __cxa_throw(puVar30,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar47 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar52 = false;
      uVar47 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar29 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x44;
      fVar72 = INFINITY;
      fVar77 = -INFINITY;
      for (uVar34 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar34 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar34 = uVar34 + 1) {
        fVar76 = *(float *)((long)(current.super_BuildRecord.prims.prims)->items + lVar29 + -4);
        if (fVar76 <= fVar72) {
          fVar72 = fVar76;
        }
        fVar76 = *(float *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0
                                   .lower.field_0 + lVar29);
        if (fVar76 <= fVar77) {
          fVar76 = fVar77;
        }
        lVar29 = lVar29 + 0x50;
        fVar77 = fVar76;
      }
      bVar52 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < fVar72 ||
               fVar77 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    }
  }
  else {
    bVar52 = false;
  }
  if (((current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar47 <=
        (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (!bVar52)) {
    uVar49 = (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar47) + 3 >> 2;
    v1.field_0.v[0] = uVar49 * 0x60;
    pTVar11 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar11;
      MutexSys::lock(&pTVar11->mutex);
      if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
             ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar11->alloc0).bytesUsed = 0;
      (pTVar11->alloc0).bytesWasted = 0;
      (pTVar11->alloc0).end = 0;
      (pTVar11->alloc0).allocBlockSize = 0;
      (pTVar11->alloc0).ptr = (char *)0x0;
      (pTVar11->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar11->alloc1).bytesUsed = 0;
        (pTVar11->alloc1).bytesWasted = 0;
        (pTVar11->alloc1).end = 0;
        (pTVar11->alloc1).allocBlockSize = 0;
        (pTVar11->alloc1).ptr = (char *)0x0;
        (pTVar11->alloc1).cur = 0;
      }
      else {
        (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar11->alloc1).ptr = (char *)0x0;
        (pTVar11->alloc1).cur = 0;
        (pTVar11->alloc1).end = 0;
        (pTVar11->alloc1).allocBlockSize = 0;
        (pTVar11->alloc1).bytesUsed = 0;
        (pTVar11->alloc1).bytesWasted = 0;
        (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar11->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = (longlong)pTVar11;
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar23 = v1.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar28 = (alloc.talloc1)->cur;
    uVar45 = (ulong)(-(int)sVar28 & 0xf);
    uVar37 = sVar28 + v1.field_0.v[0] + uVar45;
    (alloc.talloc1)->cur = uVar37;
    if ((alloc.talloc1)->end < uVar37) {
      (alloc.talloc1)->cur = sVar28;
      uVar45 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(v1.field_0.v[0] * 4) < uVar45 || v1.field_0.v[0] * 4 - uVar45 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar45;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar39;
        sVar28 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar28;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar23;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar23) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar39;
          sVar28 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar28;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar23;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar23) {
            (alloc.talloc1)->cur = 0;
            pcVar39 = (char *)0x0;
            goto LAB_004c7c40;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar28;
      }
      else {
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar45;
      pcVar39 = (alloc.talloc1)->ptr + (uVar37 - v1.field_0._0_8_);
    }
LAB_004c7c40:
    uVar45 = 7;
    if (uVar49 < 7) {
      uVar45 = uVar49;
    }
    local_1d18._8_8_ = 0x7f8000007f800000;
    local_1d18._0_8_ = 0x7f8000007f800000;
    local_1d28._8_8_ = 0xff800000ff800000;
    local_1d28._0_8_ = 0xff800000ff800000;
    local_1d38._8_8_ = 0x7f8000007f800000;
    local_1d38._0_8_ = 0x7f8000007f800000;
    local_1d48._8_8_ = 0xff800000ff800000;
    local_1d48._0_8_ = 0xff800000ff800000;
    for (uVar37 = 0; uVar34 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end,
        uVar37 != uVar49; uVar37 = uVar37 + 1) {
      pPVar7 = (current.super_BuildRecord.prims.prims)->items;
      pSVar12 = ((this->createLeaf).bvh)->scene;
      local_1af8 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
      fStack_1af4 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
      uStack_1af0 = 0;
      children.children.items[0].super_BuildRecord.depth = 0xffffffffffffffff;
      children.children.items[0].super_BuildRecord._8_4_ = 0xffffffff;
      children.children.items[0].super_BuildRecord._12_4_ = 0xffffffff;
      values[0].ref.ptr = 0xffffffffffffffff;
      values[0]._8_4_ = 0xffffffff;
      values[0]._12_4_ = 0xffffffff;
      pPVar38 = pPVar7 + uVar47;
      v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 4) {
        if (uVar47 < uVar34) {
          local_1ee8._0_4_ = (pPVar38->lbounds).bounds0.lower.field_0.m128[3];
          *(float *)((long)&children.children.items[0].super_BuildRecord.depth + lVar29) =
               local_1ee8._0_4_;
          local_1ee8._4_4_ = (pPVar38->lbounds).bounds0.upper.field_0.m128[3];
          *(float *)((long)&values[0].ref.ptr + lVar29) = local_1ee8._4_4_;
          pGVar13 = (pSVar12->geometries).items[(uint)local_1ee8._0_4_].ptr;
          lVar46 = (ulong)(uint)local_1ee8._4_4_ *
                   pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar43 = *(long *)&pGVar13->field_0x58;
          uVar44 = *(uint *)&pGVar13[1].intersectionFilterN >> 2;
          *(uint *)((long)&v0.field_0 + lVar29) = *(int *)(lVar43 + lVar46) * uVar44;
          *(uint *)((long)&v1.field_0 + lVar29) = *(int *)(lVar43 + 4 + lVar46) * uVar44;
          *(uint *)((long)&v2.field_0 + lVar29) = *(int *)(lVar43 + 8 + lVar46) * uVar44;
          *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0 + lVar29) = uVar44 * *(int *)(lVar43 + 0xc + lVar46);
          uVar47 = uVar47 + 1;
        }
        else if (lVar29 != 0) {
          *(float *)((long)&children.children.items[0].super_BuildRecord.depth + lVar29) =
               (float)children.children.items[0].super_BuildRecord.depth;
          *(undefined4 *)((long)&values[0].ref.ptr + lVar29) = 0xffffffff;
          uVar22 = v0.field_0.i[0];
          *(uint *)((long)&v0.field_0 + lVar29) = v0.field_0.i[0];
          *(undefined4 *)((long)&v1.field_0 + lVar29) = uVar22;
          *(undefined4 *)((long)&v2.field_0 + lVar29) = uVar22;
          *(undefined4 *)
           ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0 + lVar29) = uVar22;
        }
        if (uVar47 < uVar34) {
          pPVar38 = pPVar7 + uVar47;
        }
      }
      lVar29 = uVar37 * 0x60;
      *(longlong *)(pcVar39 + lVar29) = v0.field_0.v[0];
      *(longlong *)((long)(pcVar39 + lVar29) + 8) = v0.field_0.v[1];
      *(longlong *)(pcVar39 + lVar29 + 0x10) = v1.field_0.v[0];
      *(longlong *)((long)(pcVar39 + lVar29 + 0x10) + 8) = v1.field_0.v[1];
      *(longlong *)(pcVar39 + lVar29 + 0x20) = v2.field_0.v[0];
      *(longlong *)((long)(pcVar39 + lVar29 + 0x20) + 8) = v2.field_0.v[1];
      *(undefined8 *)(pcVar39 + lVar29 + 0x30) =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      *(undefined8 *)(pcVar39 + lVar29 + 0x30 + 8) =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      *(size_t *)(pcVar39 + lVar29 + 0x40) = children.children.items[0].super_BuildRecord.depth;
      *(size_t *)((long)(pcVar39 + lVar29 + 0x40) + 8) =
           CONCAT44(children.children.items[0].super_BuildRecord._12_4_,
                    children.children.items[0].super_BuildRecord._8_4_);
      *(size_t *)(pcVar39 + lVar29 + 0x50) = values[0].ref.ptr;
      *(size_t *)((long)(pcVar39 + lVar29 + 0x50) + 8) = CONCAT44(values[0]._12_4_,values[0]._8_4_);
      lVar43 = 0;
      auVar56 = _DAT_01f45a40;
      auVar75 = _DAT_01f45a30;
      auVar64 = _DAT_01f45a40;
      auVar67 = _DAT_01f45a30;
      while ((lVar43 != 4 &&
             (isLeft.split = (Split *)(ulong)*(uint *)(pcVar39 + lVar43 * 4 + lVar29 + 0x50),
             isLeft.split != (Split *)0xffffffff))) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = (pSVar12->geometries).items[*(uint *)(pcVar39 + lVar43 * 4 + lVar29 + 0x40)].ptr;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = &isLeft;
        local_1ee8._0_4_ =
             ((Geometry *)
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_)->fnumTimeSegments;
        local_1ee8._4_4_ =
             (((Geometry *)
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_)->time_range).lower;
        fVar72 = (((Geometry *)
                  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_)->time_range).upper - local_1ee8._4_4_;
        fVar76 = (local_1af8 - local_1ee8._4_4_) / fVar72;
        fVar72 = (fStack_1af4 - local_1ee8._4_4_) / fVar72;
        fVar82 = local_1ee8._0_4_ * fVar72;
        local_1ee8._4_4_ = floorf(local_1ee8._0_4_ * fVar76);
        fVar77 = ceilf(fVar82);
        iVar50 = (int)local_1ee8._4_4_;
        if (local_1ee8._4_4_ <= 0.0) {
          local_1ee8._4_4_ = 0.0;
        }
        fVar80 = fVar77;
        if (local_1ee8._0_4_ <= fVar77) {
          fVar80 = local_1ee8._0_4_;
        }
        iVar40 = -1;
        if (-1 < iVar50) {
          iVar40 = iVar50;
        }
        iVar16 = (int)local_1ee8._0_4_ + 1;
        if ((int)fVar77 < (int)local_1ee8._0_4_ + 1) {
          iVar16 = (int)fVar77;
        }
        QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)&children,(anon_class_16_2_4e716a3c *)&right,
                   (long)(int)local_1ee8._4_4_);
        QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)values,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar80);
        fVar77 = local_1ee8._0_4_ * fVar76 - local_1ee8._4_4_;
        if (iVar16 - iVar40 == 1) {
          if (fVar77 <= 0.0) {
            fVar77 = 0.0;
          }
          local_1ee8._0_4_ = 1.0 - fVar77;
          fVar60 = local_1ee8._0_4_ * (float)children.children.items[0].super_BuildRecord.depth +
                   fVar77 * (float)values[0].ref.ptr;
          fVar61 = local_1ee8._0_4_ * children.children.items[0].super_BuildRecord.depth._4_4_ +
                   fVar77 * values[0].ref.ptr._4_4_;
          fVar62 = local_1ee8._0_4_ * (float)children.children.items[0].super_BuildRecord._8_4_ +
                   fVar77 * (float)values[0]._8_4_;
          fVar63 = local_1ee8._0_4_ * (float)children.children.items[0].super_BuildRecord._12_4_ +
                   fVar77 * (float)values[0]._12_4_;
          fVar81 = local_1ee8._0_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[0] + fVar77 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          fVar83 = local_1ee8._0_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[1] + fVar77 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          fVar84 = local_1ee8._0_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[2] + fVar77 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          fVar77 = local_1ee8._0_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[3] + fVar77 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          local_1ee8._0_4_ = fVar80 - fVar82;
          if (fVar80 - fVar82 <= 0.0) {
            local_1ee8._0_4_ = 0.0;
          }
          local_1ee8._4_4_ = 1.0 - local_1ee8._0_4_;
          auVar65._0_4_ =
               (float)values[0].ref.ptr * local_1ee8._4_4_ +
               (float)children.children.items[0].super_BuildRecord.depth * local_1ee8._0_4_;
          auVar65._4_4_ =
               values[0].ref.ptr._4_4_ * local_1ee8._4_4_ +
               children.children.items[0].super_BuildRecord.depth._4_4_ * local_1ee8._0_4_;
          auVar65._8_4_ =
               (float)values[0]._8_4_ * local_1ee8._4_4_ +
               (float)children.children.items[0].super_BuildRecord._8_4_ * local_1ee8._0_4_;
          auVar65._12_4_ =
               (float)values[0]._12_4_ * local_1ee8._4_4_ +
               (float)children.children.items[0].super_BuildRecord._12_4_ * local_1ee8._0_4_;
          auVar68._0_4_ =
               local_1ee8._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               local_1ee8._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar68._4_4_ =
               local_1ee8._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               local_1ee8._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar68._8_4_ =
               local_1ee8._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               local_1ee8._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar68._12_4_ =
               local_1ee8._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               local_1ee8._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
        }
        else {
          QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&v0,(anon_class_16_2_4e716a3c *)&right,
                     (long)((int)local_1ee8._4_4_ + 1));
          QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&v1,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar80 + -1));
          if (fVar77 <= 0.0) {
            fVar77 = 0.0;
          }
          local_1ee8._4_4_ = 1.0 - fVar77;
          fVar60 = (float)children.children.items[0].super_BuildRecord.depth * local_1ee8._4_4_ +
                   (float)v0.field_0.i[0] * fVar77;
          fVar61 = children.children.items[0].super_BuildRecord.depth._4_4_ * local_1ee8._4_4_ +
                   (float)v0.field_0.i[1] * fVar77;
          fVar62 = (float)children.children.items[0].super_BuildRecord._8_4_ * local_1ee8._4_4_ +
                   (float)v0.field_0.i[2] * fVar77;
          fVar63 = (float)children.children.items[0].super_BuildRecord._12_4_ * local_1ee8._4_4_ +
                   (float)v0.field_0.i[3] * fVar77;
          fVar81 = local_1ee8._4_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[0] + fVar77 * local_1bd8.m128[0];
          fVar83 = local_1ee8._4_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[1] + fVar77 * local_1bd8.m128[1];
          fVar84 = local_1ee8._4_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[2] + fVar77 * local_1bd8.m128[2];
          fVar77 = local_1ee8._4_4_ *
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[3] + fVar77 * local_1bd8.m128[3];
          local_1ee8._4_4_ = fVar80 - fVar82;
          if (fVar80 - fVar82 <= 0.0) {
            local_1ee8._4_4_ = 0.0;
          }
          fVar82 = 1.0 - local_1ee8._4_4_;
          auVar65._0_4_ =
               (float)values[0].ref.ptr * fVar82 + (float)v1.field_0.i[0] * local_1ee8._4_4_;
          auVar65._4_4_ =
               values[0].ref.ptr._4_4_ * fVar82 + (float)v1.field_0.i[1] * local_1ee8._4_4_;
          auVar65._8_4_ =
               (float)values[0]._8_4_ * fVar82 + (float)v1.field_0.i[2] * local_1ee8._4_4_;
          auVar65._12_4_ =
               (float)values[0]._12_4_ * fVar82 + (float)v1.field_0.i[3] * local_1ee8._4_4_;
          auVar68._0_4_ =
               fVar82 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               local_1ee8._4_4_ * local_1ad8.m128[0];
          auVar68._4_4_ =
               fVar82 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               local_1ee8._4_4_ * local_1ad8.m128[1];
          auVar68._8_4_ =
               fVar82 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               local_1ee8._4_4_ * local_1ad8.m128[2];
          auVar68._12_4_ =
               fVar82 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               local_1ee8._4_4_ * local_1ad8.m128[3];
          if (iVar50 < 0) {
            iVar50 = -1;
          }
          sVar28 = (size_t)iVar50;
          while (sVar28 = sVar28 + 1, (long)sVar28 < (long)iVar16) {
            local_1ee8._4_4_ = ((float)(int)sVar28 / local_1ee8._0_4_ - fVar76) / (fVar72 - fVar76);
            fVar59 = 1.0 - local_1ee8._4_4_;
            fVar82 = auVar65._4_4_;
            fVar80 = auVar65._8_4_;
            fVar58 = auVar65._12_4_;
            fVar69 = auVar68._4_4_;
            fVar70 = auVar68._8_4_;
            fVar71 = auVar68._12_4_;
            QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      ((BBox3fa *)&v2,(anon_class_16_2_4e716a3c *)&right,sVar28);
            auVar55._0_4_ =
                 (float)v2.field_0.i[0] - (fVar60 * fVar59 + auVar65._0_4_ * local_1ee8._4_4_);
            auVar55._4_4_ = (float)v2.field_0.i[1] - (fVar61 * fVar59 + fVar82 * local_1ee8._4_4_);
            auVar55._8_4_ = (float)v2.field_0.i[2] - (fVar62 * fVar59 + fVar80 * local_1ee8._4_4_);
            auVar55._12_4_ = (float)v2.field_0.i[3] - (fVar63 * fVar59 + fVar58 * local_1ee8._4_4_);
            auVar57._0_4_ =
                 local_1e28.m128[0] - (fVar59 * fVar81 + local_1ee8._4_4_ * auVar68._0_4_);
            auVar57._4_4_ = local_1e28.m128[1] - (fVar59 * fVar83 + local_1ee8._4_4_ * fVar69);
            auVar57._8_4_ = local_1e28.m128[2] - (fVar59 * fVar84 + local_1ee8._4_4_ * fVar70);
            auVar57._12_4_ = local_1e28.m128[3] - (fVar59 * fVar77 + local_1ee8._4_4_ * fVar71);
            auVar74 = minps(auVar55,ZEXT816(0));
            auVar79 = maxps(auVar57,ZEXT816(0));
            fVar60 = fVar60 + auVar74._0_4_;
            fVar61 = fVar61 + auVar74._4_4_;
            fVar62 = fVar62 + auVar74._8_4_;
            fVar63 = fVar63 + auVar74._12_4_;
            auVar65._0_4_ = auVar65._0_4_ + auVar74._0_4_;
            auVar65._4_4_ = fVar82 + auVar74._4_4_;
            auVar65._8_4_ = fVar80 + auVar74._8_4_;
            auVar65._12_4_ = fVar58 + auVar74._12_4_;
            fVar81 = fVar81 + auVar79._0_4_;
            fVar83 = fVar83 + auVar79._4_4_;
            fVar84 = fVar84 + auVar79._8_4_;
            fVar77 = fVar77 + auVar79._12_4_;
            auVar68._0_4_ = auVar68._0_4_ + auVar79._0_4_;
            auVar68._4_4_ = fVar69 + auVar79._4_4_;
            auVar68._8_4_ = fVar70 + auVar79._8_4_;
            auVar68._12_4_ = fVar71 + auVar79._12_4_;
          }
        }
        auVar15._4_4_ = fVar61;
        auVar15._0_4_ = fVar60;
        auVar15._8_4_ = fVar62;
        auVar15._12_4_ = fVar63;
        auVar67 = minps(auVar67,auVar15);
        auVar14._4_4_ = fVar83;
        auVar14._0_4_ = fVar81;
        auVar14._8_4_ = fVar84;
        auVar14._12_4_ = fVar77;
        auVar64 = maxps(auVar64,auVar14);
        auVar75 = minps(auVar75,auVar65);
        auVar56 = maxps(auVar56,auVar68);
        lVar43 = lVar43 + 1;
      }
      local_1d18 = minps(local_1d18,auVar67);
      local_1d28 = maxps(local_1d28,auVar64);
      local_1d38 = minps(local_1d38,auVar75);
      local_1d48 = maxps(local_1d48,auVar56);
    }
    (__return_storage_ptr__->ref).ptr = uVar45 | (ulong)pcVar39 | 8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1d18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1d18._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1d28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1d28._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1d48._8_8_;
    BVar17.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar17.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar17;
    return __return_storage_ptr__;
  }
  local_1d58 = &children;
  array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)local_1d58);
  children.numChildren = 1;
  local_1ec0 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)local_1d58,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  bVar18 = false;
  local_1e98._8_8_ = 0x7f8000007f800000;
  local_1e98._0_8_ = 0x7f8000007f800000;
  local_1ea8._8_8_ = 0xff800000ff800000;
  local_1ea8._0_8_ = 0xff800000ff800000;
  do {
    prVar35 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar49 = 0;
    sVar28 = 0xffffffffffffffff;
    for (sVar42 = 0; children.numChildren != sVar42; sVar42 = sVar42 + 1) {
      uVar45 = prVar35->_end - prVar35->_begin;
      if ((((this->cfg).maxLeafSize < uVar45) || (1 < *(uint *)((long)(prVar35 + 4) + 0xc))) ||
         (bVar52)) {
        if (uVar49 < uVar45) {
          sVar28 = sVar42;
          uVar49 = uVar45;
        }
        bVar52 = false;
      }
      prVar35 = prVar35 + 0xf;
    }
    if (sVar28 == 0xffffffffffffffff) break;
    v0.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1b38.sah = INFINITY;
    local_1b38.dim = -1;
    local_1b38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1b38.data = 0;
    v1.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1a38.sah = INFINITY;
    local_1a38.dim = -1;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1a38.data = 0;
    uVar44 = children.children.items[sVar28].split.data;
    auVar56 = local_1ee8;
    if (3 < uVar44) goto LAB_004c6a87;
    this_00 = &children.children.items[sVar28].super_BuildRecord.prims;
    switch(uVar44) {
    case 0:
      v2.field_0.v[1] = 0x7f8000007f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._8_8_ = 0xff800000ff800000;
      local_1e18._0_8_ = 0x7f8000007f800000;
      local_1e18._8_8_ = 0x7f8000007f800000;
      local_1e08[0]._0_8_ = 0xff800000ff800000;
      local_1e08[0]._8_8_ = 0xff800000ff800000;
      isLeft.split = &children.children.items[sVar28].split;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.lower = 0.0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      sVar42 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      end = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range.
            _end;
      vSplitPos.field_0.i[1] = children.children.items[sVar28].split.field_2.pos;
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar29 = (long)(1 << ((byte)children.children.items[sVar28].split.dim & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar29);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      sVar25 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         ((children.children.items[sVar28].super_BuildRecord.prims.prims)->items,
                          sVar42,end,(EmptyTy *)local_1c88,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                          &reduction,&reduction2,0x80,0xc00);
      pvVar32 = children.children.items[sVar28].super_BuildRecord.prims.prims;
      BVar4 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.time_range;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bd8.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2);
      local_1ee8._0_4_ = BVar4.lower;
      local_1ee8._4_4_ = BVar4.upper;
      uVar44 = -(uint)(local_1b50.lower < local_1ee8._0_4_);
      uVar54 = -(uint)(local_1b50.upper < local_1ee8._4_4_);
      local_1b50 = (BBox1f)(CONCAT44(~uVar54 & (uint)local_1ee8._4_4_,
                                     ~uVar44 & (uint)local_1b50.lower) |
                           CONCAT44((uint)local_1b50.upper & uVar54,(uint)local_1ee8._0_4_ & uVar44)
                           );
      pvVar5 = children.children.items[sVar28].super_BuildRecord.prims.prims;
      BVar4 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.time_range;
      uStack_1ee0 = 0;
      local_1ee8._0_4_ = BVar4.lower;
      local_1ee8._4_4_ = BVar4.upper;
      auVar56 = local_1ee8;
      local_1b78 = sVar42;
      local_1b70 = sVar25;
      local_1b48 = pvVar32;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1ad8.field_1,&right);
      local_1ee8._0_4_ = BVar4.lower;
      local_1ee8._4_4_ = BVar4.upper;
      local_1a50 = (float)(~-(uint)(local_1a50 < local_1ee8._0_4_) & (uint)local_1a50 |
                          (uint)local_1ee8._0_4_ & -(uint)(local_1a50 < local_1ee8._0_4_));
      fStack_1a4c = (float)(~-(uint)(fStack_1a4c < local_1ee8._4_4_) & (uint)local_1ee8._4_4_ |
                           (uint)fStack_1a4c & -(uint)(fStack_1a4c < local_1ee8._4_4_));
      local_1a78 = sVar25;
      local_1a70 = end;
      local_1a48 = pvVar5;
      break;
    case 1:
      SetMB::deterministic_order(this_00);
      splitFallback(this,this_00,(SetMB *)&local_1bd8.field_1,(SetMB *)&local_1ad8.field_1);
      break;
    case 2:
      time_range1.lower = children.children.items[sVar28].split.field_2.fpos;
      time_range0.lower =
           children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.time_range.lower
      ;
      time_range1.upper =
           children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper
      ;
      pmVar9 = children.children.items[sVar28].super_BuildRecord.prims.prims;
      time_range0.upper = time_range1.lower;
      tVar26.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar8 = (this->heuristicTemporalSplit).device;
      ((intrusive_list_node *)
      ((long)tVar26.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x20))->my_prev_node = (intrusive_list_node *)0x0;
      pSVar36 = (Split *)children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar47 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       tVar26.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar8;
      *(undefined1 *)
       &(((atomic<unsigned_int> *)
         ((long)tVar26.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 8))->super___atomic_base<unsigned_int>)._M_i = 0;
      ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
      ((long)tVar26.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x10))->my_parent = (task_group_context *)0x0;
      *(context_list **)
       ((long)tVar26.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x18) = (context_list *)0x0;
      ptVar41 = (task_group_context *)((long)pSVar36 - uVar47);
      pSVar48 = pSVar36;
      if (ptVar41 != (task_group_context *)0x0) {
        uVar49 = (long)ptVar41 * 0x50;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar49,0);
        if (uVar49 < 0x1c00000) {
          piVar27 = (intrusive_list_node *)alignedMalloc(uVar49,0x10);
        }
        else {
          piVar27 = (intrusive_list_node *)
                    os_malloc(uVar49,(bool *)((long)tVar26.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        ((intrusive_list_node *)
        ((long)tVar26.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x20))->my_prev_node = piVar27;
        ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
        ((long)tVar26.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x10))->my_parent = ptVar41;
        *(task_group_context **)
         ((long)tVar26.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 0x18) = ptVar41;
        pSVar36 = (Split *)children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar48 = (Split *)children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
        local_1ee8._0_8_ =
             (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )tVar26.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      v2.field_0.v[1] = 0x7f8000007f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )tVar26.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               tVar26.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar9;
      if ((ulong)((long)pSVar48 - (long)pSVar36) < 0xc00) {
        isLeft.split = pSVar36;
        isLeft.vSplitPos = (vint *)pSVar48;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar48;
        vSplitPos.field_0.v[1] = (longlong)pSVar36;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&v2,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)local_1ee8._0_8_);
        cVar24 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar24 != '\0') {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar31,"task cancelled");
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar47 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar47) {
        v2.field_0.v[0] = (longlong)&time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar47,0x400,(anon_class_8_1_41ce32a5 *)&v2);
      }
      ptVar41 = (task_group_context *)CONCAT44(time_range0.upper,time_range0.lower);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right);
      SetMB::operator=((SetMB *)&local_1bd8.field_1,(SetMB *)&v2);
      uVar47 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      v2.field_0.v[1] = 0x7f8000007f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._8_8_ = 0xff800000ff800000;
      local_1e18._0_8_ = 0x7f8000007f800000;
      local_1e18._8_8_ = 0x7f8000007f800000;
      local_1e08[0]._0_8_ = 0xff800000ff800000;
      local_1e08[0]._8_8_ = 0xff800000ff800000;
      pcVar10 = (code *)children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar9;
      if ((long)pcVar10 - uVar47 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar47;
        vSplitPos.field_0.v[1] = (longlong)pcVar10;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c88._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c88._8_8_ = &reduction2;
        _reduction = pcVar10;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&v2,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c88,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,ptVar41);
        cVar24 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar24 != '\0') {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar31,"task cancelled");
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar29 = local_1990 - local_1998;
      local_1998 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1990 = lVar29 + local_1998;
      uVar47 = children.children.items[sVar28].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar29 != uVar47 - local_1998) {
        v2.field_0.v[0] = (longlong)&time_range1;
        local_1990 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar9->items,local_1998,uVar47,0x400,(anon_class_8_1_41ce32a6 *)&v2
                               );
      }
      local_1ee8._4_4_ = time_range1.upper;
      local_1ee8._0_4_ = time_range1.lower;
      uStack_1ee0 = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      SetMB::operator=((SetMB *)&local_1ad8.field_1,(SetMB *)&v2);
      bVar53 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_004c6a97;
    case 3:
      SetMB::deterministic_order(this_00);
      splitByGeometry(this,this_00,(SetMB *)&local_1bd8.field_1,(SetMB *)&local_1ad8.field_1);
    }
LAB_004c6a87:
    local_1ee8 = auVar56;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar53 = false;
LAB_004c6a97:
    findFallback((Split *)&v2,this,(SetMB *)&local_1bd8.field_1);
    vVar21 = v2;
    local_1b38.sah = (float)v2.field_0._0_4_;
    local_1b38.dim = v2.field_0._4_4_;
    local_1b38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v2.field_0._8_4_;
    local_1b38.data = v2.field_0._12_4_;
    local_1b38.mapping.num = local_1e28._0_8_;
    local_1b38.mapping.ofs.field_0._0_8_ = local_1e18._0_8_;
    local_1b38.mapping.ofs.field_0._8_8_ = local_1e18._8_8_;
    local_1b38.mapping.scale.field_0._0_8_ = local_1e08[0]._0_8_;
    local_1b38.mapping.scale.field_0._8_8_ = local_1e08[0]._8_8_;
    v2 = vVar21;
    findFallback((Split *)&v2,this,(SetMB *)&local_1ad8.field_1);
    sVar42 = children.numSharedPrimVecs;
    vVar21 = v2;
    local_1a38.sah = (float)v2.field_0._0_4_;
    local_1a38.dim = v2.field_0._4_4_;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v2.field_0._8_4_;
    local_1a38.data = v2.field_0._12_4_;
    local_1a38.mapping.num = local_1e28._0_8_;
    local_1a38.mapping.ofs.field_0._0_8_ = local_1e18._0_8_;
    local_1a38.mapping.ofs.field_0._8_8_ = local_1e18._8_8_;
    local_1a38.mapping.scale.field_0._0_8_ = local_1e08[0]._0_8_;
    local_1a38.mapping.scale.field_0._8_8_ = local_1e08[0]._8_8_;
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar6 = children.primvecs.items[sVar28];
    if (local_1b48 == pSVar6->prims) {
      pSVar6->refCount = pSVar6->refCount + 1;
      pvVar32 = local_1b48;
    }
    else {
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar20->prims = local_1b48;
      children.sharedPrimVecs.items[sVar42].refCount = 1;
      children.primvecs.items[sVar28] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar19->prims;
      pvVar32 = pSVar6->prims;
    }
    sVar42 = children.numSharedPrimVecs;
    if (local_1a48 == pvVar32) {
      children.primvecs.items[children.numChildren] = pSVar6;
      sVar42 = pSVar6->refCount;
      pSVar6->refCount = sVar42 + 1;
    }
    else {
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar20->prims = local_1a48;
      children.sharedPrimVecs.items[sVar42].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar19->prims;
      sVar42 = pSVar6->refCount - 1;
    }
    pSVar6->refCount = sVar42;
    v2 = vVar21;
    if (sVar42 == 0) {
      pvVar32 = pSVar6->prims;
      if (pvVar32 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar42 = pvVar32->size_alloced;
        pPVar7 = pvVar32->items;
        if (pPVar7 != (PrimRefMB *)0x0) {
          if (sVar42 * 0x50 < 0x1c00000) {
            alignedFree(pPVar7);
          }
          else {
            os_free(pPVar7,sVar42 * 0x50,(pvVar32->alloc).hugepages);
          }
        }
        if (sVar42 != 0) {
          pMVar8 = (pvVar32->alloc).device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar42 * -0x50,1);
        }
        pvVar32->size_active = 0;
        pvVar32->size_alloced = 0;
        pvVar32->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar32);
    }
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[sVar28].super_BuildRecord,
               (BuildRecordSplit *)&v0);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&v1);
    bVar18 = (bool)(bVar18 | bVar53);
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e48);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  pfVar33 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar28 = children.numChildren;
  while (bVar52 = sVar28 != 0, sVar28 = sVar28 - 1, bVar52) {
    bVar18 = (bool)(bVar18 | (*pfVar33 < (in->prims).super_PrimInfoMB.time_range.upper ||
                             (in->prims).super_PrimInfoMB.time_range.lower <
                             ((BBox1f *)(pfVar33 + -1))->lower));
    pfVar33 = pfVar33 + 0x3c;
  }
  if (!bVar18) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar11 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar11;
      MutexSys::lock(&pTVar11->mutex);
      if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
             ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar11->alloc0).bytesUsed = 0;
      (pTVar11->alloc0).bytesWasted = 0;
      (pTVar11->alloc0).end = 0;
      (pTVar11->alloc0).allocBlockSize = 0;
      (pTVar11->alloc0).ptr = (char *)0x0;
      (pTVar11->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar11->alloc1).bytesUsed = 0;
        (pTVar11->alloc1).bytesWasted = 0;
        (pTVar11->alloc1).end = 0;
        (pTVar11->alloc1).allocBlockSize = 0;
        (pTVar11->alloc1).ptr = (char *)0x0;
        (pTVar11->alloc1).cur = 0;
      }
      else {
        (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar11->alloc1).ptr = (char *)0x0;
        (pTVar11->alloc1).cur = 0;
        (pTVar11->alloc1).end = 0;
        (pTVar11->alloc1).allocBlockSize = 0;
        (pTVar11->alloc1).bytesUsed = 0;
        (pTVar11->alloc1).bytesWasted = 0;
        (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar11->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pTVar11;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar28 = (alloc.talloc0)->cur;
    uVar49 = (ulong)(-(int)sVar28 & 0xf);
    uVar45 = sVar28 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar49;
    (alloc.talloc0)->cur = uVar45;
    if ((alloc.talloc0)->end < uVar45) {
      (alloc.talloc0)->cur = sVar28;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar39;
        sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar28;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar39;
          sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar28;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar39 = (char *)0x0;
            goto LAB_004c780c;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar28;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar49;
      pcVar39 = (alloc.talloc0)->ptr +
                (uVar45 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_004c780c:
    pcVar39[0x60] = '\0';
    pcVar39[0x61] = '\0';
    pcVar39[0x62] = -0x80;
    pcVar39[99] = '\x7f';
    pcVar39[100] = '\0';
    pcVar39[0x65] = '\0';
    pcVar39[0x66] = -0x80;
    pcVar39[0x67] = '\x7f';
    pcVar39[0x68] = '\0';
    pcVar39[0x69] = '\0';
    pcVar39[0x6a] = -0x80;
    pcVar39[0x6b] = '\x7f';
    pcVar39[0x6c] = '\0';
    pcVar39[0x6d] = '\0';
    pcVar39[0x6e] = -0x80;
    pcVar39[0x6f] = '\x7f';
    pcVar39[0x40] = '\0';
    pcVar39[0x41] = '\0';
    pcVar39[0x42] = -0x80;
    pcVar39[0x43] = '\x7f';
    pcVar39[0x44] = '\0';
    pcVar39[0x45] = '\0';
    pcVar39[0x46] = -0x80;
    pcVar39[0x47] = '\x7f';
    pcVar39[0x48] = '\0';
    pcVar39[0x49] = '\0';
    pcVar39[0x4a] = -0x80;
    pcVar39[0x4b] = '\x7f';
    pcVar39[0x4c] = '\0';
    pcVar39[0x4d] = '\0';
    pcVar39[0x4e] = -0x80;
    pcVar39[0x4f] = '\x7f';
    pcVar39[0x20] = '\0';
    pcVar39[0x21] = '\0';
    pcVar39[0x22] = -0x80;
    pcVar39[0x23] = '\x7f';
    pcVar39[0x24] = '\0';
    pcVar39[0x25] = '\0';
    pcVar39[0x26] = -0x80;
    pcVar39[0x27] = '\x7f';
    pcVar39[0x28] = '\0';
    pcVar39[0x29] = '\0';
    pcVar39[0x2a] = -0x80;
    pcVar39[0x2b] = '\x7f';
    pcVar39[0x2c] = '\0';
    pcVar39[0x2d] = '\0';
    pcVar39[0x2e] = -0x80;
    pcVar39[0x2f] = '\x7f';
    pcVar39[0x70] = '\0';
    pcVar39[0x71] = '\0';
    pcVar39[0x72] = -0x80;
    pcVar39[0x73] = -1;
    pcVar39[0x74] = '\0';
    pcVar39[0x75] = '\0';
    pcVar39[0x76] = -0x80;
    pcVar39[0x77] = -1;
    pcVar39[0x78] = '\0';
    pcVar39[0x79] = '\0';
    pcVar39[0x7a] = -0x80;
    pcVar39[0x7b] = -1;
    pcVar39[0x7c] = '\0';
    pcVar39[0x7d] = '\0';
    pcVar39[0x7e] = -0x80;
    pcVar39[0x7f] = -1;
    pcVar39[0x50] = '\0';
    pcVar39[0x51] = '\0';
    pcVar39[0x52] = -0x80;
    pcVar39[0x53] = -1;
    pcVar39[0x54] = '\0';
    pcVar39[0x55] = '\0';
    pcVar39[0x56] = -0x80;
    pcVar39[0x57] = -1;
    pcVar39[0x58] = '\0';
    pcVar39[0x59] = '\0';
    pcVar39[0x5a] = -0x80;
    pcVar39[0x5b] = -1;
    pcVar39[0x5c] = '\0';
    pcVar39[0x5d] = '\0';
    pcVar39[0x5e] = -0x80;
    pcVar39[0x5f] = -1;
    pcVar39[0x30] = '\0';
    pcVar39[0x31] = '\0';
    pcVar39[0x32] = -0x80;
    pcVar39[0x33] = -1;
    pcVar39[0x34] = '\0';
    pcVar39[0x35] = '\0';
    pcVar39[0x36] = -0x80;
    pcVar39[0x37] = -1;
    pcVar39[0x38] = '\0';
    pcVar39[0x39] = '\0';
    pcVar39[0x3a] = -0x80;
    pcVar39[0x3b] = -1;
    pcVar39[0x3c] = '\0';
    pcVar39[0x3d] = '\0';
    pcVar39[0x3e] = -0x80;
    pcVar39[0x3f] = -1;
    pcVar39[0x80] = '\0';
    pcVar39[0x81] = '\0';
    pcVar39[0x82] = '\0';
    pcVar39[0x83] = '\0';
    pcVar39[0x84] = '\0';
    pcVar39[0x85] = '\0';
    pcVar39[0x86] = '\0';
    pcVar39[0x87] = '\0';
    pcVar39[0x88] = '\0';
    pcVar39[0x89] = '\0';
    pcVar39[0x8a] = '\0';
    pcVar39[0x8b] = '\0';
    pcVar39[0x8c] = '\0';
    pcVar39[0x8d] = '\0';
    pcVar39[0x8e] = '\0';
    pcVar39[0x8f] = '\0';
    pcVar39[0x90] = '\0';
    pcVar39[0x91] = '\0';
    pcVar39[0x92] = '\0';
    pcVar39[0x93] = '\0';
    pcVar39[0x94] = '\0';
    pcVar39[0x95] = '\0';
    pcVar39[0x96] = '\0';
    pcVar39[0x97] = '\0';
    pcVar39[0x98] = '\0';
    pcVar39[0x99] = '\0';
    pcVar39[0x9a] = '\0';
    pcVar39[0x9b] = '\0';
    pcVar39[0x9c] = '\0';
    pcVar39[0x9d] = '\0';
    pcVar39[0x9e] = '\0';
    pcVar39[0x9f] = '\0';
    pcVar39[0xa0] = '\0';
    pcVar39[0xa1] = '\0';
    pcVar39[0xa2] = '\0';
    pcVar39[0xa3] = '\0';
    pcVar39[0xa4] = '\0';
    pcVar39[0xa5] = '\0';
    pcVar39[0xa6] = '\0';
    pcVar39[0xa7] = '\0';
    pcVar39[0xa8] = '\0';
    pcVar39[0xa9] = '\0';
    pcVar39[0xaa] = '\0';
    pcVar39[0xab] = '\0';
    pcVar39[0xac] = '\0';
    pcVar39[0xad] = '\0';
    pcVar39[0xae] = '\0';
    pcVar39[0xaf] = '\0';
    pcVar39[0xb0] = '\0';
    pcVar39[0xb1] = '\0';
    pcVar39[0xb2] = '\0';
    pcVar39[0xb3] = '\0';
    pcVar39[0xb4] = '\0';
    pcVar39[0xb5] = '\0';
    pcVar39[0xb6] = '\0';
    pcVar39[0xb7] = '\0';
    pcVar39[0xb8] = '\0';
    pcVar39[0xb9] = '\0';
    pcVar39[0xba] = '\0';
    pcVar39[0xbb] = '\0';
    pcVar39[0xbc] = '\0';
    pcVar39[0xbd] = '\0';
    pcVar39[0xbe] = '\0';
    pcVar39[0xbf] = '\0';
    pcVar39[0xc0] = '\0';
    pcVar39[0xc1] = '\0';
    pcVar39[0xc2] = '\0';
    pcVar39[0xc3] = '\0';
    pcVar39[0xc4] = '\0';
    pcVar39[0xc5] = '\0';
    pcVar39[0xc6] = '\0';
    pcVar39[199] = '\0';
    pcVar39[200] = '\0';
    pcVar39[0xc9] = '\0';
    pcVar39[0xca] = '\0';
    pcVar39[0xcb] = '\0';
    pcVar39[0xcc] = '\0';
    pcVar39[0xcd] = '\0';
    pcVar39[0xce] = '\0';
    pcVar39[0xcf] = '\0';
    pcVar39[0xd0] = '\0';
    pcVar39[0xd1] = '\0';
    pcVar39[0xd2] = '\0';
    pcVar39[0xd3] = '\0';
    pcVar39[0xd4] = '\0';
    pcVar39[0xd5] = '\0';
    pcVar39[0xd6] = '\0';
    pcVar39[0xd7] = '\0';
    pcVar39[0xd8] = '\0';
    pcVar39[0xd9] = '\0';
    pcVar39[0xda] = '\0';
    pcVar39[0xdb] = '\0';
    pcVar39[0xdc] = '\0';
    pcVar39[0xdd] = '\0';
    pcVar39[0xde] = '\0';
    pcVar39[0xdf] = '\0';
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pcVar3 = pcVar39 + lVar29 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_004c7874;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar11 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar11;
    MutexSys::lock(&pTVar11->mutex);
    if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
           ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar11->alloc0).bytesUsed = 0;
    (pTVar11->alloc0).bytesWasted = 0;
    (pTVar11->alloc0).end = 0;
    (pTVar11->alloc0).allocBlockSize = 0;
    (pTVar11->alloc0).ptr = (char *)0x0;
    (pTVar11->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar11->alloc1).bytesUsed = 0;
      (pTVar11->alloc1).bytesWasted = 0;
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
      (pTVar11->alloc1).ptr = (char *)0x0;
      (pTVar11->alloc1).cur = 0;
    }
    else {
      (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar11->alloc1).ptr = (char *)0x0;
      (pTVar11->alloc1).cur = 0;
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
      (pTVar11->alloc1).bytesUsed = 0;
      (pTVar11->alloc1).bytesWasted = 0;
      (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar11->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)pTVar11;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar28 = (alloc.talloc0)->cur;
  uVar49 = (ulong)(-(int)sVar28 & 0xf);
  uVar45 = sVar28 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar49;
  (alloc.talloc0)->cur = uVar45;
  if ((alloc.talloc0)->end < uVar45) {
    (alloc.talloc0)->cur = sVar28;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar39;
      sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar28;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar39;
        sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar28;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar39 = (char *)0x0;
          goto LAB_004c76e5;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar28;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar49;
    pcVar39 = (alloc.talloc0)->ptr +
              (uVar45 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_004c76e5:
  pcVar39[0xe0] = '\0';
  pcVar39[0xe1] = '\0';
  pcVar39[0xe2] = -0x80;
  pcVar39[0xe3] = '\x7f';
  pcVar39[0xe4] = '\0';
  pcVar39[0xe5] = '\0';
  pcVar39[0xe6] = -0x80;
  pcVar39[0xe7] = '\x7f';
  pcVar39[0xe8] = '\0';
  pcVar39[0xe9] = '\0';
  pcVar39[0xea] = -0x80;
  pcVar39[0xeb] = '\x7f';
  pcVar39[0xec] = '\0';
  pcVar39[0xed] = '\0';
  pcVar39[0xee] = -0x80;
  pcVar39[0xef] = '\x7f';
  pcVar39[0xf0] = '\0';
  pcVar39[0xf1] = '\0';
  pcVar39[0xf2] = -0x80;
  pcVar39[0xf3] = -1;
  pcVar39[0xf4] = '\0';
  pcVar39[0xf5] = '\0';
  pcVar39[0xf6] = -0x80;
  pcVar39[0xf7] = -1;
  pcVar39[0xf8] = '\0';
  pcVar39[0xf9] = '\0';
  pcVar39[0xfa] = -0x80;
  pcVar39[0xfb] = -1;
  pcVar39[0xfc] = '\0';
  pcVar39[0xfd] = '\0';
  pcVar39[0xfe] = -0x80;
  pcVar39[0xff] = -1;
  pcVar39[0x60] = '\0';
  pcVar39[0x61] = '\0';
  pcVar39[0x62] = -0x80;
  pcVar39[99] = '\x7f';
  pcVar39[100] = '\0';
  pcVar39[0x65] = '\0';
  pcVar39[0x66] = -0x80;
  pcVar39[0x67] = '\x7f';
  pcVar39[0x68] = '\0';
  pcVar39[0x69] = '\0';
  pcVar39[0x6a] = -0x80;
  pcVar39[0x6b] = '\x7f';
  pcVar39[0x6c] = '\0';
  pcVar39[0x6d] = '\0';
  pcVar39[0x6e] = -0x80;
  pcVar39[0x6f] = '\x7f';
  pcVar39[0x40] = '\0';
  pcVar39[0x41] = '\0';
  pcVar39[0x42] = -0x80;
  pcVar39[0x43] = '\x7f';
  pcVar39[0x44] = '\0';
  pcVar39[0x45] = '\0';
  pcVar39[0x46] = -0x80;
  pcVar39[0x47] = '\x7f';
  pcVar39[0x48] = '\0';
  pcVar39[0x49] = '\0';
  pcVar39[0x4a] = -0x80;
  pcVar39[0x4b] = '\x7f';
  pcVar39[0x4c] = '\0';
  pcVar39[0x4d] = '\0';
  pcVar39[0x4e] = -0x80;
  pcVar39[0x4f] = '\x7f';
  pcVar39[0x20] = '\0';
  pcVar39[0x21] = '\0';
  pcVar39[0x22] = -0x80;
  pcVar39[0x23] = '\x7f';
  pcVar39[0x24] = '\0';
  pcVar39[0x25] = '\0';
  pcVar39[0x26] = -0x80;
  pcVar39[0x27] = '\x7f';
  pcVar39[0x28] = '\0';
  pcVar39[0x29] = '\0';
  pcVar39[0x2a] = -0x80;
  pcVar39[0x2b] = '\x7f';
  pcVar39[0x2c] = '\0';
  pcVar39[0x2d] = '\0';
  pcVar39[0x2e] = -0x80;
  pcVar39[0x2f] = '\x7f';
  pcVar39[0x70] = '\0';
  pcVar39[0x71] = '\0';
  pcVar39[0x72] = -0x80;
  pcVar39[0x73] = -1;
  pcVar39[0x74] = '\0';
  pcVar39[0x75] = '\0';
  pcVar39[0x76] = -0x80;
  pcVar39[0x77] = -1;
  pcVar39[0x78] = '\0';
  pcVar39[0x79] = '\0';
  pcVar39[0x7a] = -0x80;
  pcVar39[0x7b] = -1;
  pcVar39[0x7c] = '\0';
  pcVar39[0x7d] = '\0';
  pcVar39[0x7e] = -0x80;
  pcVar39[0x7f] = -1;
  pcVar39[0x50] = '\0';
  pcVar39[0x51] = '\0';
  pcVar39[0x52] = -0x80;
  pcVar39[0x53] = -1;
  pcVar39[0x54] = '\0';
  pcVar39[0x55] = '\0';
  pcVar39[0x56] = -0x80;
  pcVar39[0x57] = -1;
  pcVar39[0x58] = '\0';
  pcVar39[0x59] = '\0';
  pcVar39[0x5a] = -0x80;
  pcVar39[0x5b] = -1;
  pcVar39[0x5c] = '\0';
  pcVar39[0x5d] = '\0';
  pcVar39[0x5e] = -0x80;
  pcVar39[0x5f] = -1;
  pcVar39[0x30] = '\0';
  pcVar39[0x31] = '\0';
  pcVar39[0x32] = -0x80;
  pcVar39[0x33] = -1;
  pcVar39[0x34] = '\0';
  pcVar39[0x35] = '\0';
  pcVar39[0x36] = -0x80;
  pcVar39[0x37] = -1;
  pcVar39[0x38] = '\0';
  pcVar39[0x39] = '\0';
  pcVar39[0x3a] = -0x80;
  pcVar39[0x3b] = -1;
  pcVar39[0x3c] = '\0';
  pcVar39[0x3d] = '\0';
  pcVar39[0x3e] = -0x80;
  pcVar39[0x3f] = -1;
  pcVar39[0x80] = '\0';
  pcVar39[0x81] = '\0';
  pcVar39[0x82] = '\0';
  pcVar39[0x83] = '\0';
  pcVar39[0x84] = '\0';
  pcVar39[0x85] = '\0';
  pcVar39[0x86] = '\0';
  pcVar39[0x87] = '\0';
  pcVar39[0x88] = '\0';
  pcVar39[0x89] = '\0';
  pcVar39[0x8a] = '\0';
  pcVar39[0x8b] = '\0';
  pcVar39[0x8c] = '\0';
  pcVar39[0x8d] = '\0';
  pcVar39[0x8e] = '\0';
  pcVar39[0x8f] = '\0';
  pcVar39[0x90] = '\0';
  pcVar39[0x91] = '\0';
  pcVar39[0x92] = '\0';
  pcVar39[0x93] = '\0';
  pcVar39[0x94] = '\0';
  pcVar39[0x95] = '\0';
  pcVar39[0x96] = '\0';
  pcVar39[0x97] = '\0';
  pcVar39[0x98] = '\0';
  pcVar39[0x99] = '\0';
  pcVar39[0x9a] = '\0';
  pcVar39[0x9b] = '\0';
  pcVar39[0x9c] = '\0';
  pcVar39[0x9d] = '\0';
  pcVar39[0x9e] = '\0';
  pcVar39[0x9f] = '\0';
  pcVar39[0xa0] = '\0';
  pcVar39[0xa1] = '\0';
  pcVar39[0xa2] = '\0';
  pcVar39[0xa3] = '\0';
  pcVar39[0xa4] = '\0';
  pcVar39[0xa5] = '\0';
  pcVar39[0xa6] = '\0';
  pcVar39[0xa7] = '\0';
  pcVar39[0xa8] = '\0';
  pcVar39[0xa9] = '\0';
  pcVar39[0xaa] = '\0';
  pcVar39[0xab] = '\0';
  pcVar39[0xac] = '\0';
  pcVar39[0xad] = '\0';
  pcVar39[0xae] = '\0';
  pcVar39[0xaf] = '\0';
  pcVar39[0xb0] = '\0';
  pcVar39[0xb1] = '\0';
  pcVar39[0xb2] = '\0';
  pcVar39[0xb3] = '\0';
  pcVar39[0xb4] = '\0';
  pcVar39[0xb5] = '\0';
  pcVar39[0xb6] = '\0';
  pcVar39[0xb7] = '\0';
  pcVar39[0xb8] = '\0';
  pcVar39[0xb9] = '\0';
  pcVar39[0xba] = '\0';
  pcVar39[0xbb] = '\0';
  pcVar39[0xbc] = '\0';
  pcVar39[0xbd] = '\0';
  pcVar39[0xbe] = '\0';
  pcVar39[0xbf] = '\0';
  pcVar39[0xc0] = '\0';
  pcVar39[0xc1] = '\0';
  pcVar39[0xc2] = '\0';
  pcVar39[0xc3] = '\0';
  pcVar39[0xc4] = '\0';
  pcVar39[0xc5] = '\0';
  pcVar39[0xc6] = '\0';
  pcVar39[199] = '\0';
  pcVar39[200] = '\0';
  pcVar39[0xc9] = '\0';
  pcVar39[0xca] = '\0';
  pcVar39[0xcb] = '\0';
  pcVar39[0xcc] = '\0';
  pcVar39[0xcd] = '\0';
  pcVar39[0xce] = '\0';
  pcVar39[0xcf] = '\0';
  pcVar39[0xd0] = '\0';
  pcVar39[0xd1] = '\0';
  pcVar39[0xd2] = '\0';
  pcVar39[0xd3] = '\0';
  pcVar39[0xd4] = '\0';
  pcVar39[0xd5] = '\0';
  pcVar39[0xd6] = '\0';
  pcVar39[0xd7] = '\0';
  pcVar39[0xd8] = '\0';
  pcVar39[0xd9] = '\0';
  pcVar39[0xda] = '\0';
  pcVar39[0xdb] = '\0';
  pcVar39[0xdc] = '\0';
  pcVar39[0xdd] = '\0';
  pcVar39[0xde] = '\0';
  pcVar39[0xdf] = '\0';
  local_1ec0 = 6;
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pcVar3 = pcVar39 + lVar29 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_004c7874:
  local_1ec0 = local_1ec0 | (ulong)pcVar39;
  pBVar51 = &values[0].dt;
  local_1ed8._8_8_ = 0xff800000ff800000;
  local_1ed8._0_8_ = 0xff800000ff800000;
  uStack_1ee0 = 0x7f8000007f800000;
  local_1ee8._0_8_ =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x7f8000007f800000;
  for (uVar49 = 0; auVar75 = _DAT_01f4b860, auVar56 = _DAT_01f4b850, uVar49 < children.numChildren;
      uVar49 = uVar49 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&v0,this,(BuildRecord *)local_1d58,alloc);
    vVar21 = v0;
    pBVar51[-10].lower = (float)v0.field_0.v[0]._0_4_;
    pBVar51[-10].upper = (float)v0.field_0._4_4_;
    auVar56._4_4_ = local_1bd8.m128[1];
    auVar56._0_4_ = local_1bd8.m128[0];
    auVar56._8_4_ = local_1bd8.m128[2];
    auVar56._12_4_ = local_1bd8.m128[3];
    *(undefined1 (*) [16])(pBVar51 + -8) = auVar56;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar51 + -6) = local_1bc8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar51 + -4) = local_1bb8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar51 + -2) = local_1ba8;
    pBVar51->lower = (float)local_1b98[0]._0_4_;
    pBVar51->upper = (float)local_1b98[0]._4_4_;
    local_1ee8 = minps(local_1ee8,auVar56);
    local_1ed8 = maxps(local_1ed8,(undefined1  [16])local_1bc8);
    local_1e98 = minps(local_1e98,(undefined1  [16])local_1bb8);
    local_1ea8 = maxps(local_1ea8,(undefined1  [16])local_1ba8);
    local_1d58 = local_1d58 + 0xf0;
    pBVar51 = pBVar51 + 0xc;
    v0 = vVar21;
  }
  uVar49 = (ulong)pcVar39 & 0xfffffffffffffff0;
  if (((uint)local_1ec0 & 0xf) == 1) {
    pfVar33 = &values[0].dt.upper;
    for (sVar28 = 0; children.numChildren != sVar28; sVar28 = sVar28 + 1) {
      *(undefined8 *)(uVar49 + sVar28 * 8) = *(undefined8 *)(pfVar33 + -0x15);
      fVar77 = ((BBox1f *)(pfVar33 + -1))->lower;
      fVar76 = 1.0 / (*pfVar33 - fVar77);
      fVar82 = -fVar77 * fVar76;
      fVar72 = 1.0 - fVar82;
      auVar66._0_4_ = pfVar33[-0x11] * fVar72 + pfVar33[-9] * fVar82;
      auVar66._4_4_ = pfVar33[-0x10] * fVar72 + pfVar33[-8] * fVar82;
      auVar66._8_4_ = pfVar33[-0xf] * fVar72 + pfVar33[-7] * fVar82;
      auVar66._12_4_ = pfVar33[-0xe] * fVar72 + pfVar33[-6] * fVar82;
      auVar73._0_4_ = fVar72 * pfVar33[-0xd] + fVar82 * pfVar33[-5];
      auVar73._4_4_ = fVar72 * pfVar33[-0xc] + fVar82 * pfVar33[-4];
      auVar73._8_4_ = fVar72 * pfVar33[-0xb] + fVar82 * pfVar33[-3];
      auVar73._12_4_ = fVar72 * pfVar33[-10] + fVar82 * pfVar33[-2];
      fVar76 = (1.0 - fVar77) * fVar76;
      fVar77 = 1.0 - fVar76;
      auVar79._0_4_ = pfVar33[-0x11] * fVar77 + pfVar33[-9] * fVar76;
      auVar79._4_4_ = pfVar33[-0x10] * fVar77 + pfVar33[-8] * fVar76;
      auVar79._8_4_ = pfVar33[-0xf] * fVar77 + pfVar33[-7] * fVar76;
      auVar79._12_4_ = pfVar33[-0xe] * fVar77 + pfVar33[-6] * fVar76;
      auVar78._0_4_ = fVar77 * pfVar33[-0xd] + fVar76 * pfVar33[-5];
      auVar78._4_4_ = fVar77 * pfVar33[-0xc] + fVar76 * pfVar33[-4];
      auVar78._8_4_ = fVar77 * pfVar33[-0xb] + fVar76 * pfVar33[-3];
      auVar78._12_4_ = fVar77 * pfVar33[-10] + fVar76 * pfVar33[-2];
      auVar67 = minps(auVar66,auVar75);
      auVar74 = maxps(auVar73,auVar56);
      auVar64 = minps(auVar79,auVar75);
      auVar79 = maxps(auVar78,auVar56);
      fVar77 = auVar67._0_4_ - ABS(auVar67._0_4_) * 4.7683716e-07;
      fVar72 = auVar67._4_4_ - ABS(auVar67._4_4_) * 4.7683716e-07;
      fVar76 = auVar67._8_4_ - ABS(auVar67._8_4_) * 4.7683716e-07;
      fVar82 = ABS(auVar74._0_4_) * 4.7683716e-07 + auVar74._0_4_;
      fVar80 = ABS(auVar74._4_4_) * 4.7683716e-07 + auVar74._4_4_;
      fVar81 = ABS(auVar74._8_4_) * 4.7683716e-07 + auVar74._8_4_;
      *(float *)(uVar49 + 0x20 + sVar28 * 4) = fVar77;
      *(float *)(uVar49 + 0x40 + sVar28 * 4) = fVar72;
      *(float *)(uVar49 + 0x60 + sVar28 * 4) = fVar76;
      *(float *)(uVar49 + 0x30 + sVar28 * 4) = fVar82;
      *(float *)(uVar49 + 0x50 + sVar28 * 4) = fVar80;
      *(float *)(uVar49 + 0x70 + sVar28 * 4) = fVar81;
      *(float *)(uVar49 + 0x80 + sVar28 * 4) =
           (auVar64._0_4_ - ABS(auVar64._0_4_) * 4.7683716e-07) - fVar77;
      *(float *)(uVar49 + 0xa0 + sVar28 * 4) =
           (auVar64._4_4_ - ABS(auVar64._4_4_) * 4.7683716e-07) - fVar72;
      *(float *)(uVar49 + 0xc0 + sVar28 * 4) =
           (auVar64._8_4_ - ABS(auVar64._8_4_) * 4.7683716e-07) - fVar76;
      *(float *)(uVar49 + 0x90 + sVar28 * 4) =
           (ABS(auVar79._0_4_) * 4.7683716e-07 + auVar79._0_4_) - fVar82;
      *(float *)(uVar49 + 0xb0 + sVar28 * 4) =
           (ABS(auVar79._4_4_) * 4.7683716e-07 + auVar79._4_4_) - fVar80;
      *(float *)(uVar49 + 0xd0 + sVar28 * 4) =
           (ABS(auVar79._8_4_) * 4.7683716e-07 + auVar79._8_4_) - fVar81;
      pfVar33 = pfVar33 + 0x18;
    }
  }
  else {
    pfVar33 = &values[0].dt.upper;
    for (sVar28 = 0; children.numChildren != sVar28; sVar28 = sVar28 + 1) {
      *(undefined8 *)(uVar49 + sVar28 * 8) = *(undefined8 *)(pfVar33 + -0x15);
      fVar77 = *pfVar33;
      fVar72 = ((BBox1f *)(pfVar33 + -1))->lower;
      fVar82 = 1.0 / (fVar77 - fVar72);
      fVar80 = -fVar72 * fVar82;
      fVar76 = 1.0 - fVar80;
      auVar64._0_4_ = pfVar33[-0x11] * fVar76 + pfVar33[-9] * fVar80;
      auVar64._4_4_ = pfVar33[-0x10] * fVar76 + pfVar33[-8] * fVar80;
      auVar64._8_4_ = pfVar33[-0xf] * fVar76 + pfVar33[-7] * fVar80;
      auVar64._12_4_ = pfVar33[-0xe] * fVar76 + pfVar33[-6] * fVar80;
      auVar67._0_4_ = fVar76 * pfVar33[-0xd] + fVar80 * pfVar33[-5];
      auVar67._4_4_ = fVar76 * pfVar33[-0xc] + fVar80 * pfVar33[-4];
      auVar67._8_4_ = fVar76 * pfVar33[-0xb] + fVar80 * pfVar33[-3];
      auVar67._12_4_ = fVar76 * pfVar33[-10] + fVar80 * pfVar33[-2];
      fVar82 = (1.0 - fVar72) * fVar82;
      fVar76 = 1.0 - fVar82;
      auVar75._0_4_ = pfVar33[-0x11] * fVar76 + pfVar33[-9] * fVar82;
      auVar75._4_4_ = pfVar33[-0x10] * fVar76 + pfVar33[-8] * fVar82;
      auVar75._8_4_ = pfVar33[-0xf] * fVar76 + pfVar33[-7] * fVar82;
      auVar75._12_4_ = pfVar33[-0xe] * fVar76 + pfVar33[-6] * fVar82;
      auVar74._0_4_ = fVar76 * pfVar33[-0xd] + fVar82 * pfVar33[-5];
      auVar74._4_4_ = fVar76 * pfVar33[-0xc] + fVar82 * pfVar33[-4];
      auVar74._8_4_ = fVar76 * pfVar33[-0xb] + fVar82 * pfVar33[-3];
      auVar74._12_4_ = fVar76 * pfVar33[-10] + fVar82 * pfVar33[-2];
      auVar64 = minps(auVar64,_DAT_01f4b860);
      auVar67 = maxps(auVar67,auVar56);
      auVar75 = minps(auVar75,_DAT_01f4b860);
      auVar74 = maxps(auVar74,auVar56);
      fVar81 = auVar64._0_4_ - ABS(auVar64._0_4_) * 4.7683716e-07;
      fVar83 = auVar64._4_4_ - ABS(auVar64._4_4_) * 4.7683716e-07;
      fVar84 = auVar64._8_4_ - ABS(auVar64._8_4_) * 4.7683716e-07;
      fVar76 = ABS(auVar67._0_4_) * 4.7683716e-07 + auVar67._0_4_;
      fVar82 = ABS(auVar67._4_4_) * 4.7683716e-07 + auVar67._4_4_;
      fVar80 = ABS(auVar67._8_4_) * 4.7683716e-07 + auVar67._8_4_;
      *(float *)(uVar49 + 0x20 + sVar28 * 4) = fVar81;
      *(float *)(uVar49 + 0x40 + sVar28 * 4) = fVar83;
      *(float *)(uVar49 + 0x60 + sVar28 * 4) = fVar84;
      *(float *)(uVar49 + 0x30 + sVar28 * 4) = fVar76;
      *(float *)(uVar49 + 0x50 + sVar28 * 4) = fVar82;
      *(float *)(uVar49 + 0x70 + sVar28 * 4) = fVar80;
      *(float *)(uVar49 + 0x80 + sVar28 * 4) =
           (auVar75._0_4_ - ABS(auVar75._0_4_) * 4.7683716e-07) - fVar81;
      *(float *)(uVar49 + 0xa0 + sVar28 * 4) =
           (auVar75._4_4_ - ABS(auVar75._4_4_) * 4.7683716e-07) - fVar83;
      *(float *)(uVar49 + 0xc0 + sVar28 * 4) =
           (auVar75._8_4_ - ABS(auVar75._8_4_) * 4.7683716e-07) - fVar84;
      *(float *)(uVar49 + 0x90 + sVar28 * 4) =
           (ABS(auVar74._0_4_) * 4.7683716e-07 + auVar74._0_4_) - fVar76;
      *(float *)(uVar49 + 0xb0 + sVar28 * 4) =
           (ABS(auVar74._4_4_) * 4.7683716e-07 + auVar74._4_4_) - fVar82;
      *(float *)(uVar49 + 0xd0 + sVar28 * 4) =
           (ABS(auVar74._8_4_) * 4.7683716e-07 + auVar74._8_4_) - fVar80;
      *(float *)(uVar49 + 0xe0 + sVar28 * 4) = fVar72;
      *(uint *)(uVar49 + 0xf0 + sVar28 * 4) =
           ~-(uint)(fVar77 == 1.0) & (uint)fVar77 | -(uint)(fVar77 == 1.0) & 0x3f800001;
      pfVar33 = pfVar33 + 0x18;
    }
  }
  if (bVar18) {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    v1.field_0.v[1] = 0x7f8000007f800000;
    v1.field_0.v[0] = 0x7f8000007f800000;
    local_1ad8._0_8_ = 0xff800000ff800000;
    local_1ad8._8_8_ = 0xff800000ff800000;
    local_1ac8._0_8_ = 0x7f8000007f800000;
    local_1ac8._8_8_ = 0x7f8000007f800000;
    local_1ab8[0]._0_8_ = 0xff800000ff800000;
    local_1ab8[0]._8_8_ = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v0.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      v0.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&v0,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)local_1ee8._0_8_);
      cVar24 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar24 != '\0') {
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar31,"task cancelled");
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&v0);
    }
    (__return_storage_ptr__->ref).ptr = local_1ec0;
    *(longlong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         v2.field_0.v[1];
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e28._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e18._8_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = local_1ec0;
    *(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ee8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         uStack_1ee0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ed8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ed8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e98._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e98._8_8_;
    local_1e08[0]._0_8_ = local_1ea8._0_8_;
    local_1e08[0]._8_8_ = local_1ea8._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e08[0]._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1e08[0]._8_8_;
  BVar4.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar4.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar4;
  for (uVar49 = 0; uVar49 < children.numChildren; uVar49 = uVar49 + 1) {
    pSVar6 = children.primvecs.items[uVar49];
    psVar1 = &pSVar6->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar32 = pSVar6->prims;
      if (pvVar32 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar28 = pvVar32->size_alloced;
        pPVar7 = pvVar32->items;
        if (pPVar7 != (PrimRefMB *)0x0) {
          if (sVar28 * 0x50 < 0x1c00000) {
            alignedFree(pPVar7);
          }
          else {
            os_free(pPVar7,sVar28 * 0x50,(pvVar32->alloc).hugepages);
          }
        }
        if (sVar28 != 0) {
          pMVar8 = (pvVar32->alloc).device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar28 * -0x50,1);
        }
        pvVar32->size_active = 0;
        pvVar32->size_alloced = 0;
        pvVar32->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar32);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }